

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGValidateDefinitionList
              (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict defines)

{
  int iVar1;
  int local_24;
  int res;
  int ret;
  xmlRelaxNGDefinePtr_conflict defines_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  local_24 = 0;
  _res = defines;
  if (defines == (xmlRelaxNGDefinePtr_conflict)0x0) {
    xmlRelaxNGAddValidError
              (ctxt,XML_RELAXNG_ERR_INTERNAL,(xmlChar *)"NULL definition list",(xmlChar *)0x0,0);
    ctxt_local._4_4_ = -1;
  }
  else {
    for (; _res != (xmlRelaxNGDefinePtr_conflict)0x0; _res = _res->next) {
      if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) &&
         (ctxt->states == (xmlRelaxNGStatesPtr)0x0)) {
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOSTATE,(xmlChar *)0x0,(xmlChar *)0x0,0);
        return -1;
      }
      iVar1 = xmlRelaxNGValidateDefinition(ctxt,_res);
      if (iVar1 < 0) {
        local_24 = -1;
      }
      if (iVar1 == -1) break;
    }
    ctxt_local._4_4_ = local_24;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlRelaxNGValidateDefinitionList(xmlRelaxNGValidCtxtPtr ctxt,
                                 xmlRelaxNGDefinePtr defines)
{
    int ret = 0, res;


    if (defines == NULL) {
        VALID_ERR2(XML_RELAXNG_ERR_INTERNAL,
                   BAD_CAST "NULL definition list");
        return (-1);
    }
    while (defines != NULL) {
        if ((ctxt->state != NULL) || (ctxt->states != NULL)) {
            res = xmlRelaxNGValidateDefinition(ctxt, defines);
            if (res < 0)
                ret = -1;
        } else {
            VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
            return (-1);
        }
        if (res == -1)          /* continues on -2 */
            break;
        defines = defines->next;
    }

    return (ret);
}